

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void get_range<double,int>
               (size_t col_num,size_t nrows,double *Xc,int *Xc_ind,int *Xc_indptr,
               MissingAction missing_action,double *xmin,double *xmax,bool *unsplittable)

{
  double dVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  iVar2 = Xc_indptr[col_num + 1];
  lVar6 = (long)iVar2;
  iVar3 = Xc_indptr[col_num];
  lVar5 = (long)iVar3;
  if ((ulong)(lVar6 - lVar5) < nrows) {
    *xmin = 0.0;
    *xmax = 0.0;
  }
  if (missing_action == Fail) {
    if (iVar3 < iVar2) {
      dVar8 = *xmin;
      dVar7 = *xmax;
      do {
        dVar1 = Xc[lVar5];
        dVar9 = dVar1;
        if (dVar8 <= dVar1) {
          dVar9 = dVar8;
        }
        if (dVar1 <= dVar7) {
          dVar1 = dVar7;
        }
        lVar5 = lVar5 + 1;
        dVar8 = dVar9;
        dVar7 = dVar1;
      } while (lVar6 != lVar5);
      *xmin = dVar9;
      *xmax = dVar1;
    }
  }
  else if (iVar3 < iVar2) {
    dVar7 = *xmax;
    dVar8 = *xmin;
    do {
      dVar1 = Xc[lVar5];
      if (ABS(dVar1) != INFINITY) {
        dVar9 = dVar1;
        if (dVar8 <= dVar1) {
          dVar9 = dVar8;
        }
        dVar8 = (double)(~-(ulong)NAN(dVar8) & (ulong)dVar9 | -(ulong)NAN(dVar8) & (ulong)dVar1);
        *xmin = dVar8;
        dVar9 = dVar1;
        if (dVar1 <= dVar7) {
          dVar9 = dVar7;
        }
        dVar7 = (double)(~-(ulong)NAN(dVar7) & (ulong)dVar9 | -(ulong)NAN(dVar7) & (ulong)dVar1);
        *xmax = dVar7;
      }
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  dVar7 = *xmin;
  dVar8 = *xmax;
  bVar4 = true;
  if (((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) && (dVar7 != INFINITY || dVar8 != -INFINITY))
  {
    bVar4 = NAN(dVar8);
  }
  *unsplittable = bVar4;
  return;
}

Assistant:

void get_range(size_t col_num, size_t nrows,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if ((size_t)(Xc_indptr[col_num+1] - Xc_indptr[col_num]) < nrows)
    {
        xmin = 0;
        xmax = 0;
    }

    if (missing_action == Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xmin = (Xc[ix] < xmin)? Xc[ix] : xmin;
            xmax = (Xc[ix] > xmax)? Xc[ix] : xmax;
        }
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            if (unlikely(std::isinf(Xc[ix]))) continue;
            xmin = std::fmin(xmin, Xc[ix]);
            xmax = std::fmax(xmax, Xc[ix]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}